

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O3

Type __thiscall wasm::Literals::getType(Literals *this)

{
  array<wasm::Literal,_1UL> *paVar1;
  Literals *__range2;
  long lVar2;
  long lVar3;
  long lVar4;
  Type local_68;
  Tuple local_60;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Type *__args;
  
  lVar4 = ((long)(this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          (this->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  if (lVar4 == 0) {
    local_68.id = 0;
  }
  else if (lVar4 == 1) {
    local_68.id = (this->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (lVar4 != 0) {
      lVar2 = -0x18;
      lVar3 = 0;
      do {
        paVar1 = (array<wasm::Literal,_1UL> *)
                 ((long)&((this->super_SmallVector<wasm::Literal,_1UL>).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar2);
        if (lVar3 == 0) {
          paVar1 = &(this->super_SmallVector<wasm::Literal,_1UL>).fixed;
        }
        __args = &paVar1->_M_elems[0].type;
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_48,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,__args);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = __args->id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar4 != lVar3);
    }
    Tuple::Tuple(&local_60,(TypeList *)auStack_48);
    wasm::Type::Type(&local_68,&local_60);
    if (local_60.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.types.
                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.types.
                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  return (Type)local_68.id;
}

Assistant:

Type getType() {
    if (empty()) {
      return Type::none;
    }
    if (size() == 1) {
      return (*this)[0].type;
    }
    std::vector<Type> types;
    for (auto& val : *this) {
      types.push_back(val.type);
    }
    return Type(types);
  }